

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

bool __thiscall glslang::TParseVersions::extensionTurnedOn(TParseVersions *this,char *extension)

{
  int iVar1;
  char *extension_local;
  TParseVersions *this_local;
  
  iVar1 = (*this->_vptr_TParseVersions[7])(this,extension);
  return iVar1 - 1U < 3;
}

Assistant:

bool TParseVersions::extensionTurnedOn(const char* const extension)
{
      switch (getExtensionBehavior(extension)) {
      case EBhEnable:
      case EBhRequire:
      case EBhWarn:
          return true;
      default:
          break;
      }
      return false;
}